

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

IncrementalStateType * __thiscall
perfetto::DataSource<perfetto::TrackEvent,_perfetto::internal::TrackEventDataSourceTraits>::
TraceContext::GetIncrementalState(TraceContext *this)

{
  __atomic_base<unsigned_int> _Var1;
  IncrementalStateType *pIVar2;
  TraceContext *this_local;
  memory_order __b;
  
  _Var1._M_i = this->tls_inst_->incremental_state_generation;
  ::std::operator&(memory_order_relaxed,__memory_order_mask);
  if ((__atomic_base<unsigned_int>)_Var1._M_i !=
      static_state_.incremental_state_generation.super___atomic_base<unsigned_int>._M_i) {
    ::std::unique_ptr<void,_void_(*)(void_*)>::reset
              (&this->tls_inst_->incremental_state,(pointer)0x0);
    CreateIncrementalState(this->tls_inst_);
  }
  pIVar2 = (IncrementalStateType *)
           ::std::unique_ptr<void,_void_(*)(void_*)>::get(&this->tls_inst_->incremental_state);
  return pIVar2;
}

Assistant:

typename DataSourceTraits::IncrementalStateType* GetIncrementalState() {
      // Recreate incremental state data if it has been reset by the service.
      if (tls_inst_->incremental_state_generation !=
          static_state_.incremental_state_generation.load(
              std::memory_order_relaxed)) {
        tls_inst_->incremental_state.reset();
        CreateIncrementalState(tls_inst_);
      }
      return reinterpret_cast<typename DataSourceTraits::IncrementalStateType*>(
          tls_inst_->incremental_state.get());
    }